

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

RequestBuilder * __thiscall
restincurl::RequestBuilder::BasicAuthentication(RequestBuilder *this,string *name,string *passwd)

{
  ulong uVar1;
  pointer pOVar2;
  char *local_40;
  CURLoption local_34;
  char *local_30;
  CURLoption local_24;
  string *local_20;
  string *passwd_local;
  string *name_local;
  RequestBuilder *this_local;
  
  local_20 = passwd;
  passwd_local = name;
  name_local = (string *)this;
  if (((this->is_built_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_built_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x5f5,
                  "RequestBuilder &restincurl::RequestBuilder::BasicAuthentication(const std::string &, const std::string &)"
                 );
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      pOVar2 = std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::
               operator->(&this->options_);
      local_24 = CURLOPT_USERNAME;
      local_30 = (char *)std::__cxx11::string::c_str();
      restincurl::Options::Set<char_const*>(pOVar2,&local_24,&local_30);
      pOVar2 = std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::
               operator->(&this->options_);
      local_34 = CURLOPT_PASSWORD;
      local_40 = (char *)std::__cxx11::string::c_str();
      restincurl::Options::Set<char_const*>(pOVar2,&local_34,&local_40);
    }
  }
  return this;
}

Assistant:

RequestBuilder& BasicAuthentication(const std::string& name,
                                            const std::string& passwd) {
            assert(!is_built_);

            if (!name.empty() && !passwd.empty()) {
                options_->Set(CURLOPT_USERNAME, name.c_str());
                options_->Set(CURLOPT_PASSWORD, passwd.c_str());
            }

            return *this;
        }